

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_client.c
# Opt level: O1

QcMessage * qc_client_msgget(QcClient *client,char *qname,int msec,QcErr *err)

{
  QcSocket *socket;
  int iVar1;
  char *pcVar2;
  QcMessage *pQVar3;
  int iVar4;
  QcPrtclReply *recvbuf;
  ulong uVar5;
  ulong __size;
  QcPrtclReply prtclReply;
  QcPrtclHead prtclHead;
  QcPrtclMsgGet prtclMsgGet;
  QcPrtclReply local_80;
  QcPrtclHead local_78;
  QcPrtclMsgGet local_54;
  
  socket = client->socket;
  local_78.body_len = 0;
  local_78.reserve[0] = '\0';
  local_78.reserve[1] = '\0';
  local_78.reserve[2] = '\0';
  local_78.reserve[3] = '\0';
  local_78.reserve[4] = '\0';
  local_78.reserve[5] = '\0';
  local_78.reserve[6] = '\0';
  local_78.reserve[7] = '\0';
  local_78.reserve[8] = '\0';
  local_78.reserve[9] = '\0';
  local_78.reserve[10] = '\0';
  local_78.reserve[0xb] = '\0';
  local_78.reserve[0xc] = '\0';
  local_78.reserve[0xd] = '\0';
  local_78.reserve[0xe] = '\0';
  local_78.reserve[0xf] = '\0';
  local_78.protocol = 0xd903;
  local_78.version = 1;
  local_78.type = 0x79;
  local_78.packsn._0_2_ = 0;
  local_78.packsn._2_2_ = 0;
  local_54.wait_msec = msec;
  strcpy(local_54.qname,qname);
  local_78.body_len = 0x24;
  qc_prtcl_head_hton(&local_78);
  iVar1 = qc_tcp_send(socket,(char *)&local_78,0x1e);
  if (iVar1 == 0x1e) {
    qc_prtcl_msgget_hton(&local_54);
    iVar1 = qc_tcp_send(socket,local_54.qname,0x24);
    if (iVar1 == 0x24) {
      iVar1 = qc_tcp_recvall(socket,(char *)&local_78,0x1e);
      if (iVar1 < 1) {
        pcVar2 = "tcp recv head failed.";
      }
      else {
        qc_prtcl_head_ntoh(&local_78);
        recvbuf = &local_80;
        iVar1 = qc_tcp_recvall(socket,(char *)recvbuf,8);
        iVar4 = (int)recvbuf;
        if (0 < iVar1) {
          qc_prtcl_reply_ntoh(&local_80);
          if (local_80.result == 100) {
            pcVar2 = "time out";
            iVar1 = 0x34;
          }
          else {
            if (local_80.result == 0) {
              __size = (ulong)(local_80.msg_len + 1);
              uVar5 = __size;
              pcVar2 = (char *)malloc(__size);
              if (pcVar2 == (char *)0x0) {
                qc_client_msgget_cold_1();
                return (QcMessage *)(uVar5 + *(long *)(uVar5 + 0x10) + (long)iVar4 * 8);
              }
              memset(pcVar2,0,__size);
              iVar1 = qc_tcp_recvall(socket,pcVar2,local_80.msg_len);
              if (iVar1 < 1) {
                qc_seterr(err,0x1e,"tcp recv buff failed.");
                return (QcMessage *)0x0;
              }
              pQVar3 = qc_message_create(pcVar2,local_80.msg_len,0);
              return pQVar3;
            }
            pcVar2 = "unkown failed";
            iVar1 = 99;
          }
          goto LAB_00105b90;
        }
        pcVar2 = "tcp recv relpy failed.";
      }
    }
    else {
      pcVar2 = "tcp send body failed.";
    }
  }
  else {
    pcVar2 = "tcp send head failed.";
  }
  iVar1 = 0x1e;
LAB_00105b90:
  qc_seterr(err,iVar1,pcVar2);
  return (QcMessage *)0x0;
}

Assistant:

QcMessage* qc_client_msgget(QcClient *client, const char *qname, int msec, QcErr *err)
{
	int ret;
	QcSocket *socket = client->socket;

	QcPrtclHead prtclHead;
	memset(&prtclHead, 0, sizeof(QcPrtclHead));
	prtclHead.protocol = QC_PROTOCOL_MQ;
	prtclHead.version = QC_PROTOCOL_VERSION;
	prtclHead.type = QC_TYPE_MSGGET;
	prtclHead.packsn = 0;

	QcPrtclMsgGet prtclMsgGet;
	prtclMsgGet.wait_msec = msec;
	strcpy(prtclMsgGet.qname, qname);

	prtclHead.body_len = sizeof(QcPrtclMsgGet);

	qc_prtcl_head_hton(&prtclHead);
	ret = qc_tcp_send(socket, (char*)&prtclHead, sizeof(QcPrtclHead));
	if (ret != sizeof(QcPrtclHead)){
		qc_seterr(err, QC_ERR_SOCKET, "tcp send head failed.");
		goto failed;
	}

	qc_prtcl_msgget_hton(&prtclMsgGet);
	ret = qc_tcp_send(socket, (char*)&prtclMsgGet, sizeof(prtclMsgGet));
	if (ret != sizeof(QcPrtclMsgGet)){
		qc_seterr(err, QC_ERR_SOCKET, "tcp send body failed.");
		goto failed;
	}

	//receive
	ret = qc_tcp_recvall(socket, (char*)&prtclHead, sizeof(QcPrtclHead));
	if (ret <= 0){
		qc_seterr(err, QC_ERR_SOCKET, "tcp recv head failed.");
		goto failed;
	}
	qc_prtcl_head_ntoh(&prtclHead);

	QcPrtclReply prtclReply;
	ret = qc_tcp_recvall(socket, (char*)&prtclReply, sizeof(QcPrtclReply));
	if (ret <= 0){
		qc_seterr(err, QC_ERR_SOCKET, "tcp recv relpy failed.");
		goto failed;
	}
	qc_prtcl_reply_ntoh(&prtclReply);

	if (prtclReply.result == QC_RESULT_SUCC){
		char *buff;
		qc_malloc(buff, prtclReply.msg_len+1);

		int buff_len = prtclReply.msg_len;
		ret = qc_tcp_recvall(socket, buff, buff_len);
		if (ret <= 0){
			qc_seterr(err, QC_ERR_SOCKET, "tcp recv buff failed.");
			goto failed;
		}

		QcMessage *message = qc_message_create(buff, buff_len, 0);
		return message;

	}
	else if(prtclReply.result == QC_RESULT_TIMEOUT){
		qc_seterr(err, QC_ERR_TIMEOUT, "time out");
		goto failed;
	}
	else{
		qc_seterr(err, QC_ERR_UNKOWN, "unkown failed");
		goto failed;
	}

failed:
	return NULL;
}